

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::sendDisconnect(CommonCore *this,action_t disconnectType)

{
  bool bVar1;
  FederateStates FVar2;
  __int_type_conflict1 _Var3;
  GlobalFederateId GVar4;
  FedInfo *pFVar5;
  pointer pBVar6;
  long *in_RDI;
  string_view in_stack_00000020;
  ActionMessage disconnect;
  FedInfo fed;
  const_iterator __end1;
  const_iterator __begin1;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *__range1;
  ActionMessage bye;
  ActionMessage *in_stack_00000318;
  FilterFederate *in_stack_00000320;
  ActionMessage *in_stack_fffffffffffffd78;
  FederateState *in_stack_fffffffffffffd80;
  __atomic_base<int> *in_stack_fffffffffffffd88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd90;
  pointer in_stack_fffffffffffffd98;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffda0;
  GlobalFederateId local_224;
  undefined1 local_220 [8];
  BaseType local_218;
  CommonCore *in_stack_fffffffffffffe00;
  FedInfo local_158;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_140;
  undefined1 in_stack_fffffffffffffedb;
  int in_stack_fffffffffffffedc;
  Time in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffee8;
  GlobalFederateId in_stack_fffffffffffffefc;
  GlobalFederateId local_f4 [3];
  BaseType local_e8;
  BaseType local_e0;
  BaseTimeCoordinator *in_stack_ffffffffffffff90;
  ActionMessage *local_38;
  FederateState *local_30;
  GlobalFederateId local_10 [4];
  
  _Var3 = std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffffd88);
  if (8 < _Var3) {
    GlobalFederateId::GlobalFederateId(local_10,(GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
    std::__cxx11::string::operator_cast_to_basic_string_view(&in_stack_fffffffffffffd80->name);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
    BrokerBase::sendToLogger
              ((BrokerBase *)in_stack_fffffffffffffee0.internalTimeCode,in_stack_fffffffffffffefc,
               in_stack_fffffffffffffedc,in_stack_fffffffffffffee8,in_stack_00000020,
               (bool)in_stack_fffffffffffffedb);
    in_stack_fffffffffffffd78 = local_38;
    in_stack_fffffffffffffd80 = local_30;
  }
  checkInFlightQueriesForDisconnect(in_stack_fffffffffffffe00);
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffda0,(action_t)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  GlobalFederateId::GlobalFederateId(local_f4,(GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
  local_e8 = local_f4[0].gid;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
  begin((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
         *)in_stack_fffffffffffffd80);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::end
            ((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
              *)in_stack_fffffffffffffd80);
  while( true ) {
    bVar1 = gmlc::containers::
            BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator!=
                      ((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                       &stack0xfffffffffffffee8,&local_140);
    startingAction = (action_t)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    if (!bVar1) break;
    pFVar5 = gmlc::containers::
             BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator*
                       ((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                        &stack0xfffffffffffffee8);
    local_158.fed = pFVar5->fed;
    local_158._8_8_ = *(undefined8 *)&pFVar5->state;
    FedInfo::operator->(&local_158);
    FVar2 = FederateState::getState((FederateState *)0x5495e2);
    if (FVar2 != FINISHED) {
      in_stack_fffffffffffffda0 = (ActionMessage *)&local_158;
      FedInfo::operator->((FedInfo *)in_stack_fffffffffffffda0);
      local_e0 = (BaseType)
                 std::atomic::operator_cast_to_GlobalFederateId
                           ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffd78);
      FedInfo::operator->((FedInfo *)in_stack_fffffffffffffda0);
      FederateState::addAction(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
    if ((*(byte *)((long)in_RDI + 0x211) & 1) != 0) {
      in_stack_fffffffffffffd98 =
           CLI::std::
           unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         *)0x54967d);
      FedInfo::operator->(&local_158);
      GVar4 = std::atomic::operator_cast_to_GlobalFederateId
                        ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffd78);
      (*in_stack_fffffffffffffd98->_vptr_BaseTimeCoordinator[6])
                (in_stack_fffffffffffffd98,(ulong)(uint)GVar4.gid);
      pBVar6 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x5496ca);
      FedInfo::operator->(&local_158);
      GVar4 = std::atomic::operator_cast_to_GlobalFederateId
                        ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffd78);
      (*pBVar6->_vptr_BaseTimeCoordinator[7])(pBVar6,(ulong)(uint)GVar4.gid);
    }
    gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
    operator++((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
               in_stack_fffffffffffffd80);
  }
  if ((*(byte *)((long)in_RDI + 0x211) & 1) != 0) {
    CLI::std::
    unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
    operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                *)0x54973d);
    BaseTimeCoordinator::disconnect(in_stack_ffffffffffffff90);
  }
  if (in_RDI[0x15d] != 0) {
    FilterFederate::handleMessage(in_stack_00000320,in_stack_00000318);
  }
  ActionMessage::ActionMessage(in_stack_fffffffffffffda0,startingAction);
  GlobalFederateId::GlobalFederateId(&local_224,(GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
  local_218 = local_224.gid;
  (**(code **)(*in_RDI + 0x358))(in_RDI,0,local_220);
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd80);
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd80);
  return;
}

Assistant:

void CommonCore::sendDisconnect(action_message_def::action_t disconnectType)
{
    LOG_CONNECTIONS(global_broker_id_local, identifier, "sending disconnect");
    checkInFlightQueriesForDisconnect();
    ActionMessage bye(disconnectType);
    bye.source_id = global_broker_id_local;
    for (auto fed : loopFederates) {
        if (fed->getState() != FederateStates::FINISHED) {
            bye.dest_id = fed->global_id;
            fed->addAction(bye);
        }
        if (hasTimeDependency) {
            timeCoord->removeDependency(fed->global_id);
            timeCoord->removeDependent(fed->global_id);
        }
    }
    if (hasTimeDependency) {
        timeCoord->disconnect();
    }
    if (filterFed != nullptr) {
        filterFed->handleMessage(bye);
    }
    ActionMessage disconnect(CMD_DISCONNECT);
    disconnect.source_id = global_broker_id_local;
    transmit(parent_route_id, disconnect);
}